

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos)

{
  bool bVar1;
  ImVec2 *in_RSI;
  float fVar2;
  ImU32 cross_col;
  float cross_extent;
  ImVec2 center;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  bool is_clipped;
  float area_to_visible_ratio;
  ImRect bb_interact;
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  ImU32 in_stack_fffffffffffffea0;
  float in_stack_fffffffffffffea4;
  ImVec2 *in_stack_fffffffffffffea8;
  ImVec2 *pIVar3;
  ImDrawList *in_stack_fffffffffffffeb0;
  ImRect *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  ImGuiID id_00;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  float in_stack_fffffffffffffee8;
  ImU32 in_stack_fffffffffffffeec;
  ImVec2 *lhs;
  ImVec2 *in_stack_fffffffffffffef8;
  ImDrawList *in_stack_ffffffffffffff00;
  ImDrawList *this;
  bool *in_stack_ffffffffffffff08;
  ImGuiID id_01;
  float in_stack_ffffffffffffff24;
  ImVec2 local_cc;
  ImVec2 local_c4;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImU32 local_94;
  float local_90;
  ImVec2 local_8c;
  ImU32 local_84;
  byte local_80;
  byte local_7e;
  byte local_7d;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImVec2 local_6c;
  float local_64;
  ImRect local_60;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImRect local_30;
  ImGuiWindow *local_20;
  ImGuiContext *local_18;
  bool local_1;
  
  id_00 = (ImGuiID)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  local_18 = GImGui;
  local_20 = GImGui->CurrentWindow;
  pIVar3 = &local_48;
  ImVec2::ImVec2(pIVar3,GImGui->FontSize,GImGui->FontSize);
  local_40 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                         (ImVec2 *)0x532b76);
  local_50 = ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),0.0
                        );
  local_38 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                         (ImVec2 *)0x532bb9);
  ImRect::ImRect(&local_30,in_RSI,&local_38);
  id_01 = (ImGuiID)((ulong)in_RSI >> 0x20);
  local_60.Min = local_30.Min;
  local_60.Max = local_30.Max;
  fVar2 = ImRect::GetArea(&local_20->OuterRectClipped);
  local_64 = ImRect::GetArea(&local_30);
  local_64 = fVar2 / local_64;
  if (local_64 < 1.5) {
    local_7c = ImRect::GetSize((ImRect *)
                               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_74 = ::operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           0.0);
    local_6c = ImFloor((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    ImRect::Expand(&local_60,&local_6c);
  }
  bVar1 = ItemAdd((ImRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),id_00,
                  in_stack_fffffffffffffeb8,
                  (ImGuiItemFlags)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  local_7d = (bVar1 ^ 0xffU) & 1;
  local_80 = ButtonBehavior((ImRect *)CONCAT44(in_stack_ffffffffffffff24,fVar2),id_01,(bool *)pIVar3
                            ,in_stack_ffffffffffffff08,
                            (ImGuiButtonFlags)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  local_1 = (bool)local_80;
  if ((local_7d & 1) == 0) {
    local_84 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                           SUB84(in_stack_fffffffffffffeb0,0));
    local_8c = ImRect::GetCenter((ImRect *)
                                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    if ((local_7e & 1) != 0) {
      ImMax<float>(2.0,local_18->FontSize * 0.5 + 1.0);
      ImDrawList::AddCircleFilled
                (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                 in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    }
    fVar2 = 0.5;
    local_90 = local_18->FontSize * 0.5 * 0.7071 + -1.0;
    local_94 = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffeb0 >> 0x20),
                           SUB84(in_stack_fffffffffffffeb0,0));
    pIVar3 = &local_9c;
    ImVec2::ImVec2(pIVar3,fVar2,fVar2);
    lhs = &local_8c;
    operator-=(lhs,pIVar3);
    ImVec2::ImVec2(&local_ac,local_90,local_90);
    local_a4 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (ImVec2 *)0x532ea2);
    ImVec2::ImVec2(&local_bc,-local_90,-local_90);
    local_b4 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (ImVec2 *)0x532ee8);
    ImDrawList::AddLine(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,lhs,
                        in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
    this = local_20->DrawList;
    ImVec2::ImVec2(&local_cc,local_90,-local_90);
    local_c4 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (ImVec2 *)0x532f65);
    pIVar3 = (ImVec2 *)&stack0xffffffffffffff24;
    ImVec2::ImVec2(pIVar3,-local_90,local_90);
    ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                (ImVec2 *)0x532fa4);
    ImDrawList::AddLine(this,pIVar3,lhs,in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
    local_1 = (bool)(local_80 & 1);
  }
  return local_1;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Tweak 1: Shrink hit-testing area if button covers an abnormally large proportion of the visible region. That's in order to facilitate moving the window away. (#3825)
    // This may better be applied as a general hit-rect reduction mechanism for all widgets to ensure the area to move window is always accessible?
    const ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ImRect bb_interact = bb;
    const float area_to_visible_ratio = window->OuterRectClipped.GetArea() / bb.GetArea();
    if (area_to_visible_ratio < 1.5f)
        bb_interact.Expand(ImFloor(bb_interact.GetSize() * -0.25f));

    // Tweak 2: We intentionally allow interaction when clipped so that a mechanical Alt,Right,Activate sequence can always close a window.
    // (this isn't the regular behavior of buttons, but it doesn't affect the user much because navigation tends to keep items visible).
    bool is_clipped = !ItemAdd(bb_interact, id);

    bool hovered, held;
    bool pressed = ButtonBehavior(bb_interact, id, &hovered, &held);
    if (is_clipped)
        return pressed;

    // Render
    // FIXME: Clarify this mess
    ImU32 col = GetColorU32(held ? ImGuiCol_ButtonActive : ImGuiCol_ButtonHovered);
    ImVec2 center = bb.GetCenter();
    if (hovered)
        window->DrawList->AddCircleFilled(center, ImMax(2.0f, g.FontSize * 0.5f + 1.0f), col, 12);

    float cross_extent = g.FontSize * 0.5f * 0.7071f - 1.0f;
    ImU32 cross_col = GetColorU32(ImGuiCol_Text);
    center -= ImVec2(0.5f, 0.5f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent, +cross_extent), center + ImVec2(-cross_extent, -cross_extent), cross_col, 1.0f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent, -cross_extent), center + ImVec2(-cross_extent, +cross_extent), cross_col, 1.0f);

    return pressed;
}